

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O1

Fl_Tree_Item * __thiscall
Fl_Tree_Item::add(Fl_Tree_Item *this,Fl_Tree_Prefs *prefs,char **arr,Fl_Tree_Item *newitem)

{
  Fl_Tree_Item *pFVar1;
  char *name;
  char **ppcVar2;
  
  ppcVar2 = arr + 1;
  do {
    name = ppcVar2[-1];
    if (name == (char *)0x0) {
      return (Fl_Tree_Item *)0x0;
    }
    pFVar1 = find_child_item(this,name);
    if (pFVar1 == (Fl_Tree_Item *)0x0) {
      if (*ppcVar2 == (char *)0x0) goto LAB_001da9ef;
      pFVar1 = add(this,prefs,name,(Fl_Tree_Item *)0x0);
      if (pFVar1 == (Fl_Tree_Item *)0x0) {
        return (Fl_Tree_Item *)0x0;
      }
    }
    else if (*ppcVar2 == (char *)0x0) {
      if (newitem == (Fl_Tree_Item *)0x0) {
        return (Fl_Tree_Item *)0x0;
      }
      name = newitem->_label;
      this = pFVar1;
LAB_001da9ef:
      pFVar1 = add(this,prefs,name,newitem);
      return pFVar1;
    }
    ppcVar2 = ppcVar2 + 1;
    this = pFVar1;
  } while( true );
}

Assistant:

Fl_Tree_Item *Fl_Tree_Item::add(const Fl_Tree_Prefs &prefs,
			        char **arr,
				Fl_Tree_Item *newitem) {
  if ( !*arr ) return 0;
  // See if we can find an existing child with name requested.
  Fl_Tree_Item *child = find_child_item(*arr);
  if ( child ) {		// Child found?
    if ( *(arr+1) == 0 ) {	// ..and at end of path?
      if ( !newitem ) {		// ..and no item specified?
	return 0;		// ..error: child exists already
      } else {
        // Child found, end of path, item specified
	return child->add(prefs, newitem->label(), newitem);
      }
    }
    // Child found: more path elements to go or item specified?
    // Descend into child to handle add..
    return child->add(prefs, arr+1, newitem);	// recurse
  }
  // No child found, see if we reached end of path.
  //	If so, add as an immediate child, done
  if ( *(arr+1) == 0 )			// end of path?
    return add(prefs, *arr, newitem);	// add as immediate child

  // No child found, but more to path?
  // 	If so, create new child to handle add()
  Fl_Tree_Item *newchild;
  return (newchild=add(prefs, *arr))	      // create new immediate child
         ? newchild->add(prefs,arr+1,newitem) // it worked? recurse to add
	 : 0;				      // failed? error
}